

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O0

uint getaddrinfo_thread(void *arg)

{
  int *piVar1;
  int local_34;
  char local_2c [4];
  int rc;
  char service [12];
  thread_data *td;
  thread_sync_data *tsd;
  void *arg_local;
  
  service._4_8_ = *(undefined8 *)((long)arg + 0x58);
  curl_msnprintf(local_2c,0xc,"%d",(ulong)*(uint *)((long)arg + 0x18));
  local_34 = Curl_getaddrinfo_ex(*(char **)((long)arg + 0x10),local_2c,
                                 (addrinfo *)((long)arg + 0x28),(Curl_addrinfo **)((long)arg + 0x20)
                                );
  if (local_34 != 0) {
    piVar1 = __errno_location();
    if (*piVar1 != 0) {
      piVar1 = __errno_location();
      local_34 = *piVar1;
    }
    *(int *)((long)arg + 0x1c) = local_34;
    if (*(int *)((long)arg + 0x1c) == 0) {
      *(undefined4 *)((long)arg + 0x1c) = 0xfffffff6;
    }
  }
  pthread_mutex_lock(*arg);
  if (*(int *)((long)arg + 8) == 0) {
    *(undefined4 *)((long)arg + 8) = 1;
    pthread_mutex_unlock(*arg);
  }
  else {
    pthread_mutex_unlock(*arg);
    destroy_thread_sync_data((thread_sync_data *)arg);
    (*Curl_cfree)((void *)service._4_8_);
  }
  return 0;
}

Assistant:

static unsigned int CURL_STDCALL getaddrinfo_thread(void *arg)
{
  struct thread_sync_data *tsd = (struct thread_sync_data*)arg;
  struct thread_data *td = tsd->td;
  char service[12];
  int rc;

  snprintf(service, sizeof(service), "%d", tsd->port);

  rc = Curl_getaddrinfo_ex(tsd->hostname, service, &tsd->hints, &tsd->res);

  if(rc != 0) {
    tsd->sock_error = SOCKERRNO?SOCKERRNO:rc;
    if(tsd->sock_error == 0)
      tsd->sock_error = RESOLVER_ENOMEM;
  }
  else {
    Curl_addrinfo_set_port(tsd->res, tsd->port);
  }

  Curl_mutex_acquire(tsd->mtx);
  if(tsd->done) {
    /* too late, gotta clean up the mess */
    Curl_mutex_release(tsd->mtx);
    destroy_thread_sync_data(tsd);
    free(td);
  }
  else {
    tsd->done = 1;
    Curl_mutex_release(tsd->mtx);
  }

  return 0;
}